

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

int Wlc_PrsReadDeclaration(Wlc_Prs_t *p,char *pStart)

{
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pWVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int Type;
  byte bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  int End;
  int Beg;
  int fFound;
  int XValue;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c [3];
  
  local_40 = 0;
  local_44 = 0;
  local_3c[1] = 0;
  local_3c[2] = 0;
  local_48 = 0;
  lVar9 = 5;
  iVar3 = strncmp(pStart,"input",5);
  if (iVar3 == 0) {
    bVar12 = true;
    local_3c[1] = 1;
    local_3c[2] = 0;
  }
  else {
    iVar3 = strncmp(pStart,"output",6);
    bVar12 = iVar3 != 0;
    lVar9 = 0;
    if (!bVar12) {
      lVar9 = 6;
    }
  }
  pcVar10 = pStart + lVar9 + -1;
  do {
    pcVar11 = pcVar10 + 1;
    pcVar10 = pcVar10 + 1;
  } while (*pcVar11 == ' ');
  lVar9 = 4;
  iVar3 = strncmp(pcVar10,"wire",4);
  if (iVar3 != 0) {
    iVar3 = strncmp(pcVar10,"reg",3);
    lVar9 = (ulong)(iVar3 == 0) * 3;
  }
  pcVar10 = pcVar10 + lVar9 + -1;
  do {
    pcVar11 = pcVar10;
    pcVar10 = pcVar11 + 1;
  } while (pcVar11[1] == ' ');
  iVar3 = strncmp(pcVar10,"signed",6);
  pcVar11 = pcVar11 + 7;
  if (iVar3 != 0) {
    pcVar11 = pcVar10;
  }
  pcVar10 = Wlc_PrsFindRange(pcVar11,(int *)&local_48,(int *)&local_44);
  if (pcVar10 == (char *)0x0) {
    iVar3 = 0;
    Wlc_PrsWriteErrorMessage(p,pcVar11,"Non-standard range.");
  }
  else {
    if ((local_44 != 0 && local_48 != 0) &&
       (iVar7 = p->nNonZero[0], p->nNonZero[0] = iVar7 + 1, iVar7 == 0)) {
      p->nNonZero[1] = local_48;
      p->nNonZero[2] = local_44;
      lVar9 = (long)p->vLines->nSize;
      iVar7 = -1;
      if (0 < lVar9) {
        lVar8 = 0;
        do {
          if ((long)pcVar10 - (long)p->pBuffer < (long)p->vLines->pArray[lVar8]) {
            iVar7 = (int)lVar8 + 1;
            break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      p->nNonZero[3] = iVar7;
    }
    if (((int)(local_48 | local_44) < 0) &&
       (iVar7 = p->nNegative[0], p->nNegative[0] = iVar7 + 1, iVar7 == 0)) {
      p->nNegative[1] = local_48;
      p->nNegative[2] = local_44;
      lVar9 = (long)p->vLines->nSize;
      iVar7 = -1;
      if (0 < lVar9) {
        lVar8 = 0;
        do {
          if ((long)pcVar10 - (long)p->pBuffer < (long)p->vLines->pArray[lVar8]) {
            iVar7 = (int)lVar8 + 1;
            break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      p->nNegative[3] = iVar7;
    }
    if (((int)local_48 < (int)local_44) &&
       (iVar7 = p->nReverse[0], p->nReverse[0] = iVar7 + 1, iVar7 == 0)) {
      p->nReverse[1] = local_48;
      p->nReverse[2] = local_44;
      lVar9 = (long)p->vLines->nSize;
      iVar7 = -1;
      if (0 < lVar9) {
        lVar8 = 0;
        do {
          if ((long)pcVar10 - (long)p->pBuffer < (long)p->vLines->pArray[lVar8]) {
            iVar7 = (int)lVar8 + 1;
            break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar9 != lVar8);
      }
      p->nReverse[3] = iVar7;
    }
    do {
      pcVar10 = pcVar10 + -1;
      do {
        bVar6 = pcVar10[1];
        pcVar10 = pcVar10 + 1;
      } while (bVar6 == 0x20);
      if (((byte)(bVar6 - 0x30) < 10) || ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a)) {
        if (bVar6 == 0) {
          pcVar11 = Wlc_PrsFindName::Buffer;
        }
        else {
LAB_00373e4f:
          bVar13 = true;
          iVar7 = 0;
          pcVar11 = Wlc_PrsFindName::Buffer;
          do {
            if (((bVar13) && (9 < (byte)(bVar6 - 0x30))) && (0x19 < (byte)((bVar6 & 0xdf) + 0xbf)))
            {
              if (bVar6 != 0x24) {
                if (bVar6 == 0x5c) goto LAB_00373e94;
                if (bVar6 != 0x5f) break;
              }
LAB_00373e9b:
              bVar2 = !bVar13;
              bVar13 = true;
              if ((bVar2) && (bVar13 = false, bVar6 == 0x20)) {
                iVar7 = iVar7 + -1;
                bVar13 = iVar7 == 0;
              }
            }
            else {
              if (bVar6 != 0x5c) goto LAB_00373e9b;
LAB_00373e94:
              iVar7 = iVar7 + 1;
              bVar13 = false;
            }
            *pcVar11 = bVar6;
            pcVar11 = (char *)((byte *)pcVar11 + 1);
            bVar6 = pcVar10[1];
            pcVar10 = pcVar10 + 1;
          } while (bVar6 != 0);
        }
        *pcVar11 = 0;
        pcVar11 = pcVar10;
      }
      else if (bVar6 - 0x24 < 0x3c) {
        pcVar11 = (char *)0x0;
        if ((0x900000000000001U >> ((ulong)(bVar6 - 0x24) & 0x3f) & 1) != 0) goto LAB_00373e4f;
      }
      else {
        pcVar11 = (char *)0x0;
      }
      if (pcVar11 == (char *)0x0) {
        Wlc_PrsWriteErrorMessage(p,(char *)0x0,"Cannot read name in declaration.");
        iVar7 = 1;
        pcVar10 = (char *)0x0;
      }
      else {
        uVar4 = Abc_NamStrFindOrAdd(p->pNtk->pManName,Wlc_PrsFindName::Buffer,&local_40);
        if (local_40 == 0) {
          uVar5 = Wlc_ObjAlloc(p->pNtk,(int)local_3c._4_8_,(uint)(iVar3 == 0),local_48,local_44);
          if (!bVar12) {
            if (((int)uVar5 < 1) || (pWVar1 = p->pNtk, pWVar1->nObjsAlloc <= (int)uVar5))
            goto LAB_00374075;
            Wlc_ObjSetCo(pWVar1,pWVar1->pObjs + uVar5,0);
          }
          if (uVar5 != uVar4) {
            __assert_fail("iObj == NameId",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                          ,0x3a5,"int Wlc_PrsReadDeclaration(Wlc_Prs_t *, char *)");
          }
          do {
            pcVar10 = pcVar11;
            pcVar11 = pcVar10 + 1;
          } while (*pcVar10 == ' ');
          if (*pcVar10 == ',') {
            iVar7 = 2;
            pcVar10 = pcVar10 + 1;
          }
          else {
            Type = Wlc_PrsFindDefinition(p,pcVar10,p->vFanins,(int *)local_3c);
            iVar7 = 3;
            if (Type != 0) {
              if (((int)uVar5 < 1) || (pWVar1 = p->pNtk, pWVar1->nObjsAlloc <= (int)uVar5)) {
LAB_00374075:
                __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                              ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
              }
              pObj = pWVar1->pObjs + uVar5;
              Wlc_ObjUpdateType(pWVar1,pObj,Type);
              Wlc_ObjAddFanins(p->pNtk,pObj,p->vFanins);
              *(ushort *)pObj =
                   (ushort)*(undefined4 *)pObj & 0xf7ff | (ushort)((local_3c[0] & 1) << 0xb);
            }
          }
        }
        else {
          Wlc_PrsWriteErrorMessage
                    (p,pcVar11,"Name %s is declared more than once.",Wlc_PrsFindName::Buffer);
          iVar7 = 1;
          pcVar10 = pcVar11;
        }
      }
    } while (iVar7 == 2);
    if (iVar7 == 3) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int Wlc_PrsReadDeclaration( Wlc_Prs_t * p, char * pStart )
{
    int fFound = 0, Type = WLC_OBJ_NONE, iObj; char * pLine;
    int Signed = 0, Beg = 0, End = 0, NameId, fIsPo = 0;
    if ( Wlc_PrsStrCmp( pStart, "input" ) )
        pStart += strlen("input"), Type = WLC_OBJ_PI;
    else if ( Wlc_PrsStrCmp( pStart, "output" ) )
        pStart += strlen("output"), fIsPo = 1;
    pStart = Wlc_PrsSkipSpaces( pStart );
    if ( Wlc_PrsStrCmp( pStart, "wire" ) )
        pStart += strlen("wire");
    else if ( Wlc_PrsStrCmp( pStart, "reg" ) )
        pStart += strlen("reg");
    // read 'signed'
    pStart = Wlc_PrsFindWord( pStart, "signed", &Signed );
    // read range
    pLine = pStart;
    pStart = Wlc_PrsFindRange( pStart, &End, &Beg );
    if ( pStart == NULL )
        return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
    if ( End != 0 && Beg != 0 )
    {
        if ( p->nNonZero[0]++ == 0 )
        {
            p->nNonZero[1] = End;
            p->nNonZero[2] = Beg;
            p->nNonZero[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < 0 || Beg < 0  )
    {
        if ( p->nNegative[0]++ == 0 )
        {
            p->nNegative[1] = End;
            p->nNegative[2] = Beg;
            p->nNegative[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    if ( End < Beg )
    {
        if ( p->nReverse[0]++ == 0 )
        {
            p->nReverse[1] = End;
            p->nReverse[2] = Beg;
            p->nReverse[3] = Wlc_PrsFindLine(p, pStart);
        }
    }
    while ( 1 )
    {
        char * pName; int XValue, TypeNew;
        // read name
        pStart = Wlc_PrsFindName( pStart, &pName );
        if ( pStart == NULL )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Cannot read name in declaration." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( fFound )
            return Wlc_PrsWriteErrorMessage( p, pStart, "Name %s is declared more than once.", pName );
        iObj = Wlc_ObjAlloc( p->pNtk, Type, Signed, End, Beg );
        if ( fIsPo ) Wlc_ObjSetCo( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), 0 );
        assert( iObj == NameId );
        // check next definition
        pStart = Wlc_PrsSkipSpaces( pStart );
        if ( pStart[0] == ',' )
        {
            pStart++;
            continue;
        }
        // check definition
        TypeNew = Wlc_PrsFindDefinition( p, pStart, p->vFanins, &XValue );
        if ( TypeNew )
        {
            Wlc_Obj_t * pObj = Wlc_NtkObj( p->pNtk, iObj );
            Wlc_ObjUpdateType( p->pNtk, pObj, TypeNew );
            Wlc_ObjAddFanins( p->pNtk, pObj, p->vFanins );
            pObj->fXConst = XValue;
        }
        break;
    }
    return 1;
}